

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O2

void __thiscall ArtificialPopulation::update(ArtificialPopulation *this)

{
  ANN *this_00;
  double *__ptr;
  Logging *this_01;
  Index IVar1;
  Index IVar2;
  ValueEvent *this_02;
  Scalar *pSVar3;
  long col;
  double dVar4;
  double local_70;
  MatrixXd local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  local_70 = (this->super_Population).current_time;
  while( true ) {
    dVar4 = Clock::getCurrentTime((this->super_Population).clock);
    if (dVar4 <= local_70) break;
    Population::resetOutput(&this->super_Population);
    this_00 = this->ann;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)&this->annInput);
    ANN::predict(&local_60,this_00,(MatrixXd *)&local_48);
    __ptr = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data;
    (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    IVar1 = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    IVar2 = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         __ptr;
    local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         IVar1;
    local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         IVar2;
    free(__ptr);
    free(local_48.m_data);
    for (col = 0; col < (this->super_Population).numberOfOutputNeurons; col = col + 1) {
      this_02 = (ValueEvent *)operator_new(0x20);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &this->annOutput,0,col);
      ValueEvent::ValueEvent(this_02,*pSVar3);
      (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start[col] = (Event *)this_02;
      this_01 = (this->super_Population).logger;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &this->annOutput,0,col);
      Logging::logValue(this_01,(long)this,(int)col,3,*pSVar3);
    }
    local_70 = Clock::getDt((this->super_Population).clock);
    local_70 = local_70 + (this->super_Population).current_time;
    (this->super_Population).current_time = local_70;
  }
  return;
}

Assistant:

void ArtificialPopulation::update() {
    while(current_time < clock->getCurrentTime()) {
        resetOutput();
        annOutput = ann->predict(annInput);
        for(int i = 0; i < numberOfOutputNeurons; i++) {
            output[i] = new ValueEvent(annOutput(0, i));
            logger->logValue((long)this, i, EventType::Value, annOutput(0, i));
        }
        current_time += clock->getDt();
    }
}